

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_char[113]>
    ::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  process_attribute<pybind11::arg,_void> *in_RCX;
  process_attribute<pybind11::sibling,_void> *in_RDX;
  process_attribute<pybind11::scope,_void> *in_RSI;
  process_attribute<const_char_*,_void> *in_R8;
  EVP_PKEY_CTX *in_R9;
  function_record *r_local;
  char (*args_local_4) [113];
  arg *args_local_3;
  sibling *args_local_2;
  scope *args_local_1;
  name *args_local;
  
  process_attribute<pybind11::name,_void>::init
            ((process_attribute<pybind11::name,_void> *)ctx,in_R9);
  process_attribute<pybind11::scope,_void>::init(in_RSI,in_R9);
  process_attribute<pybind11::sibling,_void>::init(in_RDX,in_R9);
  process_attribute<pybind11::arg,_void>::init(in_RCX,in_R9);
  iVar1 = process_attribute<const_char_*,_void>::init(in_R8,in_R9);
  return iVar1;
}

Assistant:

static void init(const Args &...args, function_record *r) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(r);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(r);
        using expander = int[];
        (void) expander{
            0, ((void) process_attribute<typename std::decay<Args>::type>::init(args, r), 0)...};
    }